

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O2

bool __thiscall
tinyusdz::GPrim::get_primvar(GPrim *this,string *varname,GeomPrimvar *out_primvar,string *err)

{
  AttrMetas *this_00;
  Attribute *this_01;
  string *psVar1;
  bool bVar2;
  int n;
  uint32_t uVar3;
  const_iterator cVar4;
  value_type *pvVar5;
  value_type_conflict4 *pvVar6;
  string *args;
  _Rb_tree_header *p_Var7;
  TypedTimeSamples<std::vector<int,_std::allocator<int>_>_> tss;
  vector<int,_std::allocator<int>_> indices;
  string primvar_name;
  string index_name;
  GeomPrimvar primvar;
  allocator local_411;
  string *local_410;
  string local_408;
  _Vector_base<int,_std::allocator<int>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  string local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  string local_370;
  GeomPrimvar local_350;
  
  if (out_primvar == (GeomPrimvar *)0x0) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::assign((char *)err);
    }
    return false;
  }
  args = err;
  GeomPrimvar::GeomPrimvar(&local_350);
  ::std::operator+(&local_3d0,"primvars:",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)varname);
  cVar4 = ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
          ::find(&(this->props)._M_t,(key_type *)&local_3d0);
  p_Var7 = &(this->props)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar4._M_node != p_Var7) {
    if (*(uint *)((long)&cVar4._M_node[0x17]._M_parent + 4) < 2) {
      local_410 = err;
      GeomPrimvar::set_value(&local_350,(Attribute *)(cVar4._M_node + 2));
      ::std::__cxx11::string::_M_assign((string *)&local_350);
      this_00 = (AttrMetas *)(cVar4._M_node + 7);
      if ((char)cVar4._M_node[7]._M_color == _S_black) {
        pvVar5 = nonstd::optional_lite::optional<tinyusdz::Interpolation>::value
                           ((optional<tinyusdz::Interpolation> *)this_00);
        GeomPrimvar::set_interpolation(&local_350,*pvVar5);
      }
      if (*(char *)&cVar4._M_node[7]._M_parent == '\x01') {
        pvVar6 = nonstd::optional_lite::optional<unsigned_int>::value
                           ((optional<unsigned_int> *)&cVar4._M_node[7]._M_parent);
        GeomPrimvar::set_elementSize(&local_350,*pvVar6);
      }
      bVar2 = AttrMetas::has_unauthoredValuesIndex(this_00);
      if (bVar2) {
        n = AttrMetas::get_unauthoredValuesIndex(this_00);
        GeomPrimvar::set_unauthoredValuesIndex(&local_350,n);
      }
      ::std::operator+(&local_390,&local_3d0,":indices");
      cVar4 = ::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
              ::find(&(this->props)._M_t,(key_type *)&local_390);
      if (((_Rb_tree_header *)cVar4._M_node == p_Var7) ||
         (1 < *(uint *)((long)&cVar4._M_node[0x17]._M_parent + 4))) {
LAB_00363a29:
        GeomPrimvar::operator=(out_primvar,&local_350);
        bVar2 = true;
      }
      else {
        uVar3 = Attribute::type_id(&local_350._attr);
        psVar1 = local_410;
        if ((uVar3 >> 0x14 & 1) == 0) {
          if (local_410 != (string *)0x0) {
            ::std::__cxx11::string::string
                      ((string *)&local_3b0,
                       "Indexed GeomPrimVar with scalar PrimVar Attribute is not supported. PrimVar name: {}"
                       ,(allocator *)&local_370);
            fmt::format<std::__cxx11::string>
                      (&local_408,(fmt *)&local_3b0,&local_3d0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
            ::std::__cxx11::string::operator=((string *)psVar1,(string *)&local_408);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
        }
        else {
          this_01 = (Attribute *)(cVar4._M_node + 2);
          bVar2 = Attribute::is_connection(this_01);
          if (!bVar2) {
            bVar2 = Attribute::is_blocked(this_01);
            if (!bVar2) {
              if (cVar4._M_node[5]._M_left != cVar4._M_node[5]._M_parent) {
                local_408.field_2._M_local_buf[0] = '\0';
                local_408.field_2._1_8_ = 0;
                local_408._M_dataplus._M_p = (pointer)0x0;
                local_408._M_string_length._0_1_ = 0;
                local_408._M_string_length._1_7_ = 0;
                bVar2 = TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::from_timesamples
                                  ((TypedTimeSamples<std::vector<int,_std::allocator<int>_>_> *)
                                   &local_408,(TimeSamples *)&cVar4._M_node[5]._M_parent);
                if (bVar2) {
                  TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::operator=
                            (&local_350._ts_indices,
                             (TypedTimeSamples<std::vector<int,_std::allocator<int>_>_> *)&local_408
                            );
                }
                else if (local_410 != (string *)0x0) {
                  ::std::__cxx11::string::string
                            ((string *)&local_370,
                             "Index Attribute seems not an timesamples with int[] type: {}",
                             (allocator *)&local_3e8);
                  fmt::format<std::__cxx11::string>
                            (&local_3b0,(fmt *)&local_370,&local_390,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             args);
                  ::std::__cxx11::string::operator=((string *)local_410,(string *)&local_3b0);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                }
                ::std::
                vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
                ::~vector((vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
                           *)&local_408);
                if (!bVar2) goto LAB_00363892;
              }
              bVar2 = tinyusdz::primvar::PrimVar::has_value((PrimVar *)&cVar4._M_node[4]._M_parent);
              if (bVar2) {
                local_3e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_3e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_3e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                bVar2 = Attribute::get_value<std::vector<int,std::allocator<int>>>
                                  (this_01,(vector<int,_std::allocator<int>_> *)&local_3e8);
                psVar1 = local_410;
                if (bVar2) {
                  ::std::vector<int,_std::allocator<int>_>::operator=
                            (&local_350._indices,(vector<int,_std::allocator<int>_> *)&local_3e8);
                }
                else if (local_410 != (string *)0x0) {
                  ::std::__cxx11::string::string
                            ((string *)&local_3b0,"Index Attribute is not int[] type. Got {}",
                             &local_411);
                  Attribute::type_name_abi_cxx11_(&local_370,this_01);
                  fmt::format<std::__cxx11::string>
                            (&local_408,(fmt *)&local_3b0,(string *)&local_370,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             args);
                  ::std::__cxx11::string::operator=((string *)psVar1,(string *)&local_408);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                }
                ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_3e8);
                if (!bVar2) goto LAB_00363892;
              }
            }
            goto LAB_00363a29;
          }
          if (local_410 != (string *)0x0) {
            ::std::__cxx11::string::assign((char *)local_410);
          }
        }
LAB_00363892:
        bVar2 = false;
      }
      ::std::__cxx11::string::_M_dispose();
      goto LAB_00363a48;
    }
    if (err != (string *)0x0) {
      ::std::__cxx11::string::string
                ((string *)&local_408,"{} is not Attribute. Maybe Relationship?",
                 (allocator *)&local_3b0);
      fmt::format<std::__cxx11::string>
                (&local_390,(fmt *)&local_408,&local_3d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
      ::std::__cxx11::string::operator=((string *)err,(string *)&local_390);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
    }
  }
  bVar2 = false;
LAB_00363a48:
  ::std::__cxx11::string::_M_dispose();
  GeomPrimvar::~GeomPrimvar(&local_350);
  return bVar2;
}

Assistant:

bool GPrim::get_primvar(const std::string &varname, GeomPrimvar *out_primvar,
                        std::string *err) const {
  if (!out_primvar) {
    SET_ERROR_AND_RETURN("Output GeomPrimvar is nullptr.");
  }

  GeomPrimvar primvar;

  std::string primvar_name = kPrimvars + varname;

  const auto it = props.find(primvar_name);
  if (it == props.end()) {
    return false;
  }

  if (it->second.is_attribute()) {
    const Attribute &attr = it->second.get_attribute();

    primvar.set_value(attr);
    primvar.set_name(varname);
    if (attr.metas().interpolation.has_value()) {
      primvar.set_interpolation(attr.metas().interpolation.value());
    }
    if (attr.metas().elementSize.has_value()) {
      primvar.set_elementSize(attr.metas().elementSize.value());
    }
    if (attr.metas().has_unauthoredValuesIndex()) {
      primvar.set_unauthoredValuesIndex(attr.metas().get_unauthoredValuesIndex());
    }

  } else {
    SET_ERROR_AND_RETURN(fmt::format("{} is not Attribute. Maybe Relationship?", primvar_name));
  }

  // has indices?
  std::string index_name = primvar_name + kIndices;
  const auto indexIt = props.find(index_name);

  if (indexIt != props.end()) {
    if (indexIt->second.is_attribute()) {

      if (!(primvar.get_attribute().type_id() & value::TYPE_ID_1D_ARRAY_BIT)) {
        SET_ERROR_AND_RETURN(
            fmt::format("Indexed GeomPrimVar with scalar PrimVar Attribute is not supported. PrimVar name: {}", primvar_name));
      }

      const Attribute &indexAttr = indexIt->second.get_attribute();

      if (indexAttr.is_connection()) {
        SET_ERROR_AND_RETURN(
            "Attribute Connetion is not supported for index Attribute, since we need Stage info to find Prim referred by targetPath. Use Tydra API tydra::GetGeomPrimvar.");
      }

      if (indexAttr.is_blocked()) {
        // ignore Index attribute.
      } else {

        if (indexAttr.has_timesamples()) {
          const auto &ts = indexAttr.get_var().ts_raw();
          TypedTimeSamples<std::vector<int32_t>> tss;
          if (!tss.from_timesamples(ts)) {
            SET_ERROR_AND_RETURN(fmt::format("Index Attribute seems not an timesamples with int[] type: {}", index_name));
          }

          primvar.set_timesampled_indices(tss);
        }

        if (indexAttr.has_value()) {
          // Check if int[] type.
          // TODO: Support uint[]?
          std::vector<int32_t> indices;
          if (!indexAttr.get_value(&indices)) {
            SET_ERROR_AND_RETURN(
                fmt::format("Index Attribute is not int[] type. Got {}",
                            indexAttr.type_name()));
          }

          primvar.set_default_indices(indices);
        }
      }
    } else {
      // indices are optional, so ok to skip it.
    }
  }

  (*out_primvar) = primvar;

  return true;
}